

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O1

void * __thiscall asmjit::VMemMgr::alloc(VMemMgr *this,size_t size,uint32_t type)

{
  size_t __size;
  RbNode *size_00;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  size_t *__ptr;
  MemNode *__ptr_00;
  uint8_t *puVar4;
  MemNode *pMVar5;
  MemNode *pMVar6;
  MemNode **ppMVar7;
  uint uVar8;
  ulong *puVar9;
  MemNode **ppMVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  uint8_t *puVar14;
  size_t sVar15;
  MemNode *pMVar16;
  uint uVar17;
  PermanentNode *pPVar18;
  ulong uVar19;
  MemNode *pMVar20;
  ulong uVar21;
  PermanentNode *pPVar22;
  ulong unaff_R13;
  ulong uVar23;
  PermanentNode **ppPVar24;
  ulong uVar25;
  uint8_t *unaff_R15;
  MemNode *pMVar26;
  bool bVar27;
  bool bVar28;
  int local_a0;
  uint8_t *local_80;
  RbNode *local_58;
  MemNode *pMStack_50;
  uint8_t *puStack_48;
  uint32_t uStack_40;
  undefined4 uStack_3c;
  
  uVar25 = size + 0x1f & 0xffffffffffffffe0;
  if (type != 1) {
    if (uVar25 == 0) {
      return (void *)0x0;
    }
    pthread_mutex_lock((pthread_mutex_t *)this);
    ppMVar10 = &this->_optimal;
    uVar3 = this->_blockSize;
    pMVar5 = this->_optimal;
    pMVar26 = this->_optimal;
LAB_0015bf2a:
    while (__ptr_00 = pMVar26, __ptr_00 != (MemNode *)0x0) {
      uVar2 = __ptr_00->size - __ptr_00->used;
      if ((uVar25 <= uVar2) && ((uVar25 <= __ptr_00->largestBlock || (__ptr_00->largestBlock == 0)))
         ) goto LAB_0015bf77;
      pMVar26 = __ptr_00->next;
      if ((uVar2 < uVar3) && (pMVar26 != (MemNode *)0x0 && __ptr_00 == pMVar5)) {
        *ppMVar10 = pMVar26;
        pMVar5 = pMVar26;
      }
    }
    if (uVar3 <= uVar25) {
      uVar3 = uVar25;
    }
    uVar2 = this->_blockDensity;
    pMVar26 = (MemNode *)&stack0xffffffffffffffa8;
    puVar4 = (uint8_t *)OSUtils::allocVirtualMemory(uVar3,(size_t *)pMVar26,3);
    size_00 = local_58;
    if (puVar4 == (uint8_t *)0x0) {
LAB_0015c24c:
      __ptr_00 = (MemNode *)0x0;
    }
    else {
      uVar3 = (ulong)local_58 / uVar2;
      uVar12 = (uVar3 + 7 >> 3) + 7 & 0xfffffffffffffff8;
      __ptr_00 = (MemNode *)malloc(0x68);
      __size = uVar12 * 2;
      __ptr = (size_t *)malloc(__size);
      if ((__ptr_00 == (MemNode *)0x0) || (__ptr == (size_t *)0x0)) {
        OSUtils::releaseVirtualMemory(puVar4,(size_t)size_00);
        if (__ptr_00 != (MemNode *)0x0) {
          free(__ptr_00);
        }
        if (__ptr != (size_t *)0x0) {
          free(__ptr);
        }
        goto LAB_0015c24c;
      }
      (__ptr_00->super_RbNode).node[0] = (RbNode *)0x0;
      (__ptr_00->super_RbNode).node[1] = (RbNode *)0x0;
      (__ptr_00->super_RbNode).mem = puVar4;
      (__ptr_00->super_RbNode).red = 1;
      __ptr_00->prev = (MemNode *)0x0;
      __ptr_00->next = (MemNode *)0x0;
      __ptr_00->size = (size_t)size_00;
      __ptr_00->used = 0;
      __ptr_00->blocks = uVar3;
      __ptr_00->density = uVar2;
      __ptr_00->largestBlock = (size_t)size_00;
      memset(__ptr,0,__size);
      __ptr_00->baUsed = __ptr;
      __ptr_00->baCont = (size_t *)((long)__ptr + uVar12);
    }
    if (__ptr_00 != (MemNode *)0x0) {
      pMVar5 = this->_root;
      if (pMVar5 == (MemNode *)0x0) {
        this->_root = __ptr_00;
      }
      else {
        local_58 = (RbNode *)0x0;
        puStack_48 = (uint8_t *)0x0;
        uStack_40 = 0;
        uStack_3c = 0;
        pMStack_50 = pMVar5;
        uVar3 = 0;
        pMVar16 = (MemNode *)0x0;
        pMVar20 = (MemNode *)0x0;
        uVar17 = 0;
        while( true ) {
          uVar8 = (uint)uVar3;
          if (pMVar5 == (MemNode *)0x0) {
            (pMVar20->super_RbNode).node[uVar3] = &__ptr_00->super_RbNode;
            pMVar6 = __ptr_00;
          }
          else {
            pPVar18 = (PermanentNode *)(pMVar5->super_RbNode).node[0];
            pMVar6 = pMVar5;
            if ((((pPVar18 != (PermanentNode *)0x0) && ((int)pPVar18->used != 0)) &&
                (puVar4 = (uint8_t *)(pMVar5->super_RbNode).node[1], puVar4 != (uint8_t *)0x0)) &&
               (*(int *)(puVar4 + 0x18) != 0)) {
              (pMVar5->super_RbNode).red = 1;
              *(undefined4 *)&pPVar18->used = 0;
              puVar4[0x18] = '\0';
              puVar4[0x19] = '\0';
              puVar4[0x1a] = '\0';
              puVar4[0x1b] = '\0';
            }
          }
          if (((pMVar20 != (MemNode *)0x0) && ((int)*(size_t *)&(pMVar6->super_RbNode).red != 0)) &&
             ((int)*(size_t *)&(pMVar20->super_RbNode).red != 0)) {
            pMVar5 = (MemNode *)(pMVar26->super_RbNode).node[1];
            bVar28 = uVar17 == 0;
            bVar27 = !bVar28;
            pPVar18 = (PermanentNode *)(pMVar16->super_RbNode).node[bVar27];
            pPVar22 = (&pPVar18->prev)[bVar28];
            if (pMVar6 == (MemNode *)(pMVar20->super_RbNode).node[uVar17]) {
              ppPVar24 = &pPVar18->prev + bVar28;
            }
            else {
              uVar3 = (ulong)((uint)bVar27 * 8);
              (&pPVar18->prev)[bVar28] = *(PermanentNode **)((long)&pPVar22->prev + uVar3);
              *(PermanentNode **)((long)&pPVar22->prev + uVar3) = pPVar18;
              *(undefined4 *)&pPVar18->used = 1;
              *(undefined4 *)&pPVar22->used = 0;
              *(PermanentNode **)((long)(pMVar16->super_RbNode).node + uVar3) = pPVar22;
              ppPVar24 = &pPVar22->prev + bVar28;
              pPVar18 = pPVar22;
              pPVar22 = (&pPVar22->prev)[bVar28];
            }
            (pMVar16->super_RbNode).node[bVar27] = (RbNode *)pPVar22;
            *ppPVar24 = (PermanentNode *)pMVar16;
            (pMVar16->super_RbNode).red = 1;
            *(undefined4 *)&pPVar18->used = 0;
            (pMVar26->super_RbNode).node[pMVar5 == pMVar16] = (RbNode *)pPVar18;
          }
          if (pMVar6 == __ptr_00) break;
          uVar3 = (ulong)((pMVar6->super_RbNode).mem < (__ptr_00->super_RbNode).mem);
          if (pMVar16 != (MemNode *)0x0) {
            pMVar26 = pMVar16;
          }
          pMVar5 = (MemNode *)(pMVar6->super_RbNode).node[uVar3];
          pMVar16 = pMVar20;
          pMVar20 = pMVar6;
          uVar17 = uVar8;
        }
        this->_root = pMStack_50;
      }
      pMVar26 = this->_root;
      (pMVar26->super_RbNode).red = 0;
      pMVar5 = this->_last;
      __ptr_00->prev = pMVar5;
      if (this->_first == (MemNode *)0x0) {
        this->_first = __ptr_00;
        ppMVar7 = &this->_last;
      }
      else {
        __ptr_00->prev = pMVar5;
        ppMVar7 = &pMVar5->next;
        ppMVar10 = &this->_last;
      }
      *ppMVar7 = __ptr_00;
      *ppMVar10 = __ptr_00;
      iVar1 = rbAssert(&pMVar26->super_RbNode);
      if (iVar1 < 1) {
        alloc();
      }
      unaff_R13 = 0;
      local_80 = (uint8_t *)((__ptr_00->density + (uVar25 - 1)) / __ptr_00->density);
      this->_allocatedBytes = this->_allocatedBytes + __ptr_00->size;
    }
    if (__ptr_00 != (MemNode *)0x0) goto LAB_0015c423;
    goto LAB_0015c48f;
  }
  pthread_mutex_lock((pthread_mutex_t *)this);
  ppPVar24 = &this->_permanent;
  __ptr_00 = (MemNode *)ppPVar24;
  do {
    __ptr_00 = (MemNode *)(__ptr_00->super_RbNode).node[0];
    if (__ptr_00 == (MemNode *)0x0) {
      __ptr_00 = (MemNode *)malloc(0x20);
      if (__ptr_00 == (MemNode *)0x0) goto LAB_0015c48f;
      sVar15 = 0x8000;
      if (0x8000 < uVar25) {
        sVar15 = uVar25;
      }
      puVar4 = (uint8_t *)
               OSUtils::allocVirtualMemory(sVar15,(size_t *)&(__ptr_00->super_RbNode).mem,3);
      (__ptr_00->super_RbNode).node[1] = (RbNode *)puVar4;
      if (puVar4 == (uint8_t *)0x0) goto LAB_0015c487;
      *(size_t *)&(__ptr_00->super_RbNode).red = 0;
      (__ptr_00->super_RbNode).node[0] = (RbNode *)*ppPVar24;
      *ppPVar24 = (PermanentNode *)__ptr_00;
      break;
    }
  } while ((long)(__ptr_00->super_RbNode).mem - *(size_t *)&(__ptr_00->super_RbNode).red < uVar25);
  sVar15 = *(size_t *)&(__ptr_00->super_RbNode).red;
  unaff_R15 = (uint8_t *)((long)(__ptr_00->super_RbNode).node[1] + sVar15);
  *(size_t *)&(__ptr_00->super_RbNode).red = sVar15 + uVar25;
  this->_usedBytes = this->_usedBytes + uVar25;
LAB_0015c492:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return unaff_R15;
LAB_0015bf77:
  uVar2 = __ptr_00->blocks;
  uVar12 = __ptr_00->density;
  local_80 = (uint8_t *)((uVar12 + (uVar25 - 1)) / uVar12);
  puVar4 = (uint8_t *)0x0;
  unaff_R13 = 0;
  if (uVar2 != 0) {
    puVar9 = __ptr_00->baUsed;
    puVar4 = (uint8_t *)0x0;
    unaff_R15 = (uint8_t *)0x0;
    uVar11 = 0;
    do {
      if (*puVar9 == 0xffffffffffffffff) {
        if (puVar4 < unaff_R15) {
          puVar4 = unaff_R15;
        }
        uVar11 = uVar11 + 0x40;
        unaff_R15 = (uint8_t *)0x0;
      }
      else {
        unaff_R13 = uVar11 + 0x40;
        uVar19 = uVar2 - uVar11;
        if (unaff_R13 <= uVar2) {
          uVar19 = 0x40;
        }
        local_a0 = 0;
        bVar27 = uVar19 != 0;
        if (bVar27) {
          uVar23 = 1;
          uVar21 = 0;
          puVar14 = unaff_R15;
          do {
            if ((uVar23 & *puVar9) == 0) {
              unaff_R15 = puVar14 + 1;
              if (unaff_R15 == local_80) {
                unaff_R13 = (uVar11 - (long)puVar14) + uVar21;
                local_a0 = 9;
                break;
              }
            }
            else {
              if (puVar4 < puVar14) {
                puVar4 = puVar14;
              }
              unaff_R15 = (uint8_t *)0x0;
            }
            uVar21 = uVar21 + 1;
            uVar23 = uVar23 * 2;
            bVar27 = uVar21 < uVar19;
            puVar14 = unaff_R15;
            local_a0 = 0;
          } while (bVar27);
        }
        uVar11 = unaff_R13;
        if (bVar27) goto LAB_0015c085;
      }
      puVar9 = puVar9 + 1;
      unaff_R13 = uVar11;
    } while (uVar11 < uVar2);
  }
  __ptr_00->largestBlock = (long)puVar4 * uVar12;
  __ptr_00 = __ptr_00->next;
  local_a0 = 0;
LAB_0015c085:
  pMVar26 = __ptr_00;
  if (local_a0 != 0) goto code_r0x0015c097;
  goto LAB_0015bf2a;
code_r0x0015c097:
  if (local_a0 == 9) {
LAB_0015c423:
    _SetBits(__ptr_00->baUsed,unaff_R13,(size_t)local_80);
    _SetBits(__ptr_00->baCont,unaff_R13,(size_t)(local_80 + -1));
    sVar15 = __ptr_00->density;
    lVar13 = (long)local_80 * sVar15;
    __ptr_00->used = __ptr_00->used + lVar13;
    __ptr_00->largestBlock = 0;
    this->_usedBytes = this->_usedBytes + lVar13;
    lVar13 = sVar15 * unaff_R13;
    if ((lVar13 < 0) ||
       (puVar4 = (__ptr_00->super_RbNode).mem, unaff_R15 = puVar4 + lVar13,
       puVar4 + (__ptr_00->size - uVar25) < unaff_R15)) {
      alloc();
LAB_0015c487:
      free(__ptr_00);
LAB_0015c48f:
      unaff_R15 = (uint8_t *)0x0;
    }
  }
  goto LAB_0015c492;
}

Assistant:

void* VMemMgr::alloc(size_t size, uint32_t type) noexcept {
  if (type == kAllocPermanent)
    return vMemMgrAllocPermanent(this, size);
  else
    return vMemMgrAllocFreeable(this, size);
}